

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker_thread.hpp
# Opt level: O3

void __thiscall
boost::threadpool::detail::
worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>
::run(worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>
      *this)

{
  pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
  *this_00;
  bool bVar1;
  shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>
  p;
  shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>
  sStack_68;
  undefined1 local_58 [32];
  bool local_38;
  undefined1 local_30 [32];
  
  local_30._8_8_ = died_unexpectedly;
  local_30._16_8_ = 0;
  local_30._0_8_ =
       function0<void>::
       assign_to<boost::_bi::bind_t<void,boost::_mfi::mf0<void,boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,boost::threadpool::fifo_scheduler,boost::threadpool::static_size,boost::threadpool::resize_controller,boost::threadpool::wait_for_all_tasks>>>,boost::_bi::list1<boost::_bi::value<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,boost::threadpool::fifo_scheduler,boost::threadpool::static_size,boost::threadpool::resize_controller,boost::threadpool::wait_for_all_tasks>>*>>>>(boost::_bi::bind_t<void,boost::_mfi::mf0<void,boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,boost::threadpool::fifo_scheduler,boost::threadpool::static_size,boost::threadpool::resize_controller,boost::threadpool::wait_for_all_tasks>>>,boost::_bi::list1<boost::_bi::value<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,boost::threadpool::fifo_scheduler,boost::threadpool::static_size,boost::threadpool::resize_controller,boost::threadpool::wait_for_all_tasks>>*>>>)
       ::stored_vtable + 1;
  local_58._0_8_ =
       function0<void>::
       assign_to<boost::_bi::bind_t<void,boost::_mfi::mf0<void,boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,boost::threadpool::fifo_scheduler,boost::threadpool::static_size,boost::threadpool::resize_controller,boost::threadpool::wait_for_all_tasks>>>,boost::_bi::list1<boost::_bi::value<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,boost::threadpool::fifo_scheduler,boost::threadpool::static_size,boost::threadpool::resize_controller,boost::threadpool::wait_for_all_tasks>>*>>>>(boost::_bi::bind_t<void,boost::_mfi::mf0<void,boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,boost::threadpool::fifo_scheduler,boost::threadpool::static_size,boost::threadpool::resize_controller,boost::threadpool::wait_for_all_tasks>>>,boost::_bi::list1<boost::_bi::value<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,boost::threadpool::fifo_scheduler,boost::threadpool::static_size,boost::threadpool::resize_controller,boost::threadpool::wait_for_all_tasks>>*>>>)
       ::stored_vtable + 1;
  local_58._8_8_ = died_unexpectedly;
  local_58._16_8_ = 0;
  local_38 = true;
  local_58._24_8_ = this;
  local_30._24_8_ = this;
  function0<void>::~function0((function0<void> *)local_30);
  do {
    bVar1 = pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
            ::execute_task((this->m_pool).px);
  } while (bVar1);
  local_38 = false;
  this_00 = (this->m_pool).px;
  shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,boost::threadpool::fifo_scheduler,boost::threadpool::static_size,boost::threadpool::resize_controller,boost::threadpool::wait_for_all_tasks>>>
  ::
  shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,boost::threadpool::fifo_scheduler,boost::threadpool::static_size,boost::threadpool::resize_controller,boost::threadpool::wait_for_all_tasks>>>
            ((shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,boost::threadpool::fifo_scheduler,boost::threadpool::static_size,boost::threadpool::resize_controller,boost::threadpool::wait_for_all_tasks>>>
              *)&sStack_68,
             (weak_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>
              *)this);
  pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
  ::worker_destructed(this_00,&sStack_68);
  boost::detail::shared_count::~shared_count(&sStack_68.pn);
  scope_guard::~scope_guard((scope_guard *)local_58);
  return;
}

Assistant:

void run()
	  { 
		  scope_guard notify_exception(bind(&worker_thread::died_unexpectedly, this));

		  while(m_pool->execute_task()) {}

		  notify_exception.disable();
		  m_pool->worker_destructed(this->shared_from_this());
	  }